

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O1

bool __thiscall lzham::symbol_codec::start_encoding(symbol_codec *this,uint expected_file_size)

{
  bool bVar1;
  
  this->m_mode = cEncoding;
  this->m_total_model_updates = 0;
  this->m_total_bits_written = 0;
  bVar1 = put_bits_init(this,expected_file_size);
  if (bVar1) {
    if ((this->m_output_syms).m_size != 0) {
      (this->m_output_syms).m_size = 0;
    }
    if ((this->m_arith_output_buf).m_size != 0) {
      (this->m_arith_output_buf).m_size = 0;
    }
    this->m_arith_base = 0;
    this->m_arith_value = 0;
    this->m_arith_length = 0xffffffff;
    this->m_arith_total_bits = 0;
  }
  return bVar1;
}

Assistant:

bool symbol_codec::start_encoding(uint expected_file_size)
   {
      m_mode = cEncoding;

      m_total_model_updates = 0;
      m_total_bits_written = 0;

      if (!put_bits_init(expected_file_size))
         return false;

      m_output_syms.try_resize(0);

      arith_start_encoding();

      return true;
   }